

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParseString(TidyDocImpl *doc,TidyOptionImpl *option)

{
  TidyConfigImpl *config;
  tchar tVar1;
  tchar c;
  Bool BVar2;
  bool bVar3;
  tchar tVar4;
  ulong uVar5;
  tmbchar buf [8192];
  
  config = &doc->config;
  tVar1 = SkipWhite(config);
  if ((tVar1 == 0x27) || (tVar4 = 0, c = tVar1, tVar1 == 0x22)) {
    c = AdvanceChar(config);
    tVar4 = tVar1;
  }
  uVar5 = 0;
  bVar3 = false;
  do {
    if (uVar5 == 0x1ffe) {
      uVar5 = 0x1ffe;
LAB_001348d0:
      buf[uVar5] = '\0';
      SetOptionValue(doc,option->id,buf);
      return yes;
    }
    while( true ) {
      if (((c + 1 < 0xf) && ((0x4801U >> (c + 1 & 0x1f) & 1) != 0)) || (tVar4 != 0 && c == tVar4)) {
        uVar5 = uVar5 & 0xffffffff;
        goto LAB_001348d0;
      }
      BVar2 = prvTidyIsWhite(c);
      if (BVar2 == no) goto LAB_001348b6;
      if (bVar3) break;
      c = AdvanceChar(config);
      bVar3 = false;
    }
    c = 0x20;
LAB_001348b6:
    buf[uVar5] = (tmbchar)c;
    uVar5 = uVar5 + 1;
    c = AdvanceChar(config);
    bVar3 = true;
  } while( true );
}

Assistant:

Bool ParseString( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[8192];
    uint i = 0;
    tchar delim = 0;
    Bool waswhite = yes;

    tchar c = SkipWhite( cfg );

    if ( c == '"' || c == '\'' )
    {
        delim = c;
        c = AdvanceChar( cfg );
    }

    while ( i < sizeof(buf)-2 && c != EndOfStream && c != '\r' && c != '\n' )
    {
        if ( delim && c == delim )
            break;

        if ( TY_(IsWhite)(c) )
        {
            if ( waswhite )
            {
                c = AdvanceChar( cfg );
                continue;
            }
            c = ' ';
        }
        else
            waswhite = no;

        buf[i++] = (tmbchar) c;
        c = AdvanceChar( cfg );
    }
    buf[i] = '\0';

    SetOptionValue( doc, option->id, buf );
    return yes;
}